

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

BIO * BIO_new_file(char *filename,char *mode)

{
  FILE *stream;
  BIO *pBVar1;
  int *piVar2;
  int reason;
  int line;
  
  stream = fopen64(filename,mode);
  if (stream == (FILE *)0x0) {
    ERR_put_error(2,0,0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                  ,0x44);
    ERR_add_error_data(5,"fopen(\'",filename,"\',\'",mode,"\')");
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      reason = 0x6e;
      line = 0x48;
    }
    else {
      reason = 0x70;
      line = 0x4a;
    }
    pBVar1 = (BIO *)0x0;
    ERR_put_error(0x11,0,reason,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                  ,line);
  }
  else {
    pBVar1 = BIO_new_fp(stream,1);
    if (pBVar1 == (BIO *)0x0) {
      fclose(stream);
      pBVar1 = (BIO *)0x0;
    }
  }
  return pBVar1;
}

Assistant:

BIO *BIO_new_file(const char *filename, const char *mode) {
  BIO *ret;
  FILE *file;

  file = fopen_if_available(filename, mode);
  if (file == NULL) {
    OPENSSL_PUT_SYSTEM_ERROR();

    ERR_add_error_data(5, "fopen('", filename, "','", mode, "')");
    if (errno == ENOENT) {
      OPENSSL_PUT_ERROR(BIO, BIO_R_NO_SUCH_FILE);
    } else {
      OPENSSL_PUT_ERROR(BIO, BIO_R_SYS_LIB);
    }
    return NULL;
  }

  ret = BIO_new_fp(file, BIO_CLOSE);
  if (ret == NULL) {
    fclose(file);
    return NULL;
  }

  return ret;
}